

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O3

void INTERACTIONS::eval_count_of_generated_ft
               (vw *all,example *ec,size_t *new_features_cnt,float *new_features_value)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  features *pfVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  float *pfVar9;
  char *pcVar10;
  pointer pbVar11;
  char *pcVar12;
  ulong uVar13;
  features *pfVar14;
  ulong uVar15;
  size_type sVar16;
  long lVar17;
  float *__ptr;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  iterator __begin2;
  pointer pbVar22;
  int64_t d;
  long lVar23;
  float fVar24;
  float fVar25;
  iterator __end2;
  float local_94;
  pointer local_90;
  char *local_88;
  long local_80;
  v_array<float> local_78;
  size_t *local_58;
  float *local_50;
  features *local_48;
  pointer local_40;
  long local_38;
  
  *new_features_cnt = 0;
  *new_features_value = 0.0;
  local_78.end_array = (float *)0x0;
  local_78.erase_count = 0;
  local_78._begin = (float *)0x0;
  local_78._end = (float *)0x0;
  pbVar22 = (all->interactions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (all->interactions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (all->permutations == true) {
    for (; pbVar22 != pbVar11; pbVar22 = pbVar22 + 1) {
      if (pbVar22->_M_string_length == 0) {
        lVar7 = 1;
        fVar25 = 1.0;
      }
      else {
        lVar7 = 1;
        sVar16 = 0;
        fVar25 = 1.0;
        do {
          bVar1 = (pbVar22->_M_dataplus)._M_p[sVar16];
          lVar7 = ((long)(ec->super_example_predict).feature_space[bVar1].values._end -
                   (long)(ec->super_example_predict).feature_space[bVar1].values._begin >> 2) *
                  lVar7;
          if (lVar7 == 0) goto LAB_0021e657;
          fVar25 = fVar25 * (ec->super_example_predict).feature_space[bVar1].sum_feat_sq;
          sVar16 = sVar16 + 1;
        } while (pbVar22->_M_string_length != sVar16);
      }
      *new_features_cnt = *new_features_cnt + lVar7;
      *new_features_value = fVar25 + *new_features_value;
LAB_0021e657:
    }
  }
  else if (pbVar22 != pbVar11) {
    pfVar14 = (ec->super_example_predict).feature_space;
    __ptr = (float *)0x0;
    local_90 = pbVar11;
    local_58 = new_features_cnt;
    local_50 = new_features_value;
    local_48 = pfVar14;
    do {
      sVar16 = pbVar22->_M_string_length;
      if (sVar16 == 0) {
        lVar7 = 1;
        fVar25 = 1.0;
LAB_0021e9f2:
        *local_58 = *local_58 + lVar7;
        *local_50 = fVar25 + *local_50;
      }
      else {
        pcVar10 = (pbVar22->_M_dataplus)._M_p;
        pcVar12 = pcVar10 + sVar16;
        lVar7 = 1;
        fVar25 = 1.0;
        pcVar20 = pcVar10;
        local_40 = pbVar22;
        do {
          cVar2 = *pcVar20;
          if ((pcVar20 == pcVar12 + -1) || (cVar2 != pcVar20[1])) {
            lVar7 = lVar7 * ((long)pfVar14[cVar2].values._end - (long)pfVar14[cVar2].values._begin
                            >> 2);
            pbVar11 = local_90;
            if (lVar7 == 0) goto LAB_0021ea0e;
            fVar24 = pfVar14[cVar2].sum_feat_sq;
          }
          else {
            uVar15 = 2;
            if (pcVar20 + 2 < pcVar12) {
              lVar3 = 2;
              do {
                uVar15 = uVar15 + (cVar2 == pcVar20[lVar3]);
                lVar3 = lVar3 + 1;
              } while ((long)pcVar12 - (long)pcVar20 != lVar3);
            }
            local_80 = lVar7;
            local_88 = pcVar20;
            if (local_78._end == __ptr) {
              uVar8 = 0;
            }
            else {
              uVar4 = 0;
              do {
                __ptr[uVar4] = 0.0;
                uVar4 = uVar4 + 1;
                uVar8 = (long)local_78._end - (long)local_78._begin >> 2;
                __ptr = local_78._begin;
              } while (uVar4 < uVar8);
            }
            while (uVar8 < uVar15) {
              local_94 = 0.0;
              v_array<float>::push_back(&local_78,&local_94);
              __ptr = local_78._begin;
              uVar8 = (long)local_78._end - (long)local_78._begin >> 2;
            }
            pfVar5 = pfVar14 + cVar2;
            pfVar9 = (pfVar5->values)._begin;
            if ((pfVar5->values)._end == pfVar9) {
              pbVar11 = local_90;
              if (uVar15 != 0) goto LAB_0021ea0e;
              fVar24 = __ptr[-1];
              lVar7 = 1;
            }
            else {
              uVar8 = 0;
              do {
                uVar4 = uVar8;
                fVar24 = pfVar9[uVar4] * pfVar9[uVar4];
                *local_78._begin = *local_78._begin + fVar24;
                if (1 < uVar15) {
                  uVar8 = 1;
                  do {
                    local_78._begin[uVar8] =
                         local_78._begin[uVar8 - 1] * fVar24 + local_78._begin[uVar8];
                    uVar8 = uVar8 + 1;
                  } while (uVar15 != uVar8);
                }
                uVar8 = uVar4 + 1;
                pfVar9 = (pfVar5->values)._begin;
                uVar18 = (long)(pfVar5->values)._end - (long)pfVar9 >> 2;
                uVar19 = uVar18 - uVar8;
              } while (uVar8 <= uVar18 && uVar19 != 0);
              local_38 = uVar15 - 1;
              fVar24 = local_78._begin[uVar15 - 1];
              lVar3 = -uVar15;
              lVar21 = 0;
              uVar8 = 0;
              lVar7 = 0;
              do {
                if (uVar8 == 0) {
                  uVar18 = 1;
                }
                else {
                  lVar6 = uVar4 + uVar8;
                  if (uVar4 == 0 || ((long)uVar8 < 0 || lVar6 < (long)uVar8)) {
                    uVar18 = (ulong)((long)uVar8 < 0 || lVar6 < (long)uVar8) ^ 1;
                  }
                  else {
                    lVar23 = 1;
                    uVar18 = 1;
                    do {
                      lVar17 = uVar18 * lVar6;
                      lVar6 = lVar6 + -1;
                      uVar18 = lVar17 / lVar23;
                      lVar17 = lVar21 + lVar23;
                      lVar23 = lVar23 + 1;
                    } while (lVar17 != 0);
                  }
                }
                uVar13 = uVar15 - uVar8;
                if (uVar19 < uVar13) {
                  lVar6 = 0;
                }
                else {
                  if ((long)uVar13 < 0 || (long)uVar19 < (long)uVar13) {
                    lVar6 = 0;
                  }
                  else {
                    lVar6 = 1;
                    if ((uVar15 != uVar8) && (uVar13 != uVar19)) {
                      lVar23 = 1;
                      uVar13 = uVar19;
                      do {
                        lVar6 = lVar6 * uVar13;
                        uVar13 = uVar13 - 1;
                        lVar6 = lVar6 / lVar23;
                        lVar17 = lVar3 + lVar23;
                        lVar23 = lVar23 + 1;
                      } while (lVar17 != 0);
                    }
                  }
                  lVar6 = lVar6 * uVar18;
                }
                lVar7 = lVar7 + lVar6;
                uVar8 = uVar8 + 1;
                lVar21 = lVar21 + -1;
                lVar3 = lVar3 + 1;
                pfVar14 = local_48;
                __ptr = local_78._begin;
                pbVar22 = local_40;
              } while (uVar8 != uVar15 + 1 + (ulong)(uVar15 == 0xffffffffffffffff));
            }
            lVar7 = local_80 * lVar7;
            pcVar20 = local_88 + (uVar15 - 1);
            pcVar10 = (pbVar22->_M_dataplus)._M_p;
            sVar16 = pbVar22->_M_string_length;
          }
          fVar25 = fVar25 * fVar24;
          pcVar20 = pcVar20 + 1;
          pcVar12 = pcVar10 + sVar16;
        } while (pcVar20 != pcVar12);
        pbVar11 = local_90;
        if (lVar7 != 0) goto LAB_0021e9f2;
      }
LAB_0021ea0e:
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar11);
    if (__ptr != (float *)0x0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

void eval_count_of_generated_ft(vw& all, example& ec, size_t& new_features_cnt, float& new_features_value)
{
  new_features_cnt = 0;
  new_features_value = 0.;

  v_array<float> results = v_init<float>();

  if (all.permutations)
  {
    // just multiply precomputed values for all namespaces
    for (std::string& inter : all.interactions)
    {
      size_t num_features_in_inter = 1;
      float sum_feat_sq_in_inter = 1.;

      for (namespace_index ns : inter)
      {
        num_features_in_inter *= ec.feature_space[ns].size();
        sum_feat_sq_in_inter *= ec.feature_space[ns].sum_feat_sq;
        if (num_features_in_inter == 0)
          break;
      }

      if (num_features_in_inter == 0)
        continue;

      new_features_cnt += num_features_in_inter;
      new_features_value += sum_feat_sq_in_inter;
    }
  }
  else  // case of simple combinations
  {
#ifdef DEBUG_EVAL_COUNT_OF_GEN_FT
    size_t correct_features_cnt = 0;
    float correct_features_value = 0.;
    eval_gen_data dat(correct_features_cnt, correct_features_value);
    generate_interactions<eval_gen_data, uint64_t, ft_cnt>(all, ec, dat);
#endif

    for (std::string& inter : all.interactions)
    {
      size_t num_features_in_inter = 1;
      float sum_feat_sq_in_inter = 1.;

      for (auto ns = inter.begin(); ns != inter.end(); ++ns)
      {
        if ((ns == inter.end() - 1) || (*ns != *(ns + 1)))  // neighbour namespaces are different
        {
          // just multiply precomputed values
          const int nsc = *ns;
          num_features_in_inter *= ec.feature_space[nsc].size();
          sum_feat_sq_in_inter *= ec.feature_space[nsc].sum_feat_sq;
          if (num_features_in_inter == 0)
            break;  // one of namespaces has no features - go to next interaction
        }
        else  // we are at beginning of a block made of same namespace (interaction is preliminary sorted)
        {
          // let's find out real length of this block
          size_t order_of_inter = 2;  // alredy compared ns == ns+1

          for (auto ns_end = ns + 2; ns_end < inter.end(); ++ns_end)
            if (*ns == *ns_end)
              ++order_of_inter;

          // namespace is same for whole block
          features& fs = ec.feature_space[(const int)*ns];

          // count number of features with value != 1.;
          size_t cnt_ft_value_non_1 = 0;

          // in this block we shall calculate number of generated features and sum of their values
          // keeping in mind rules applicable for simple combinations instead of permutations

          // let's calculate sum of their squared value for whole block

          // ensure results as big as order_of_inter and empty.
          for (size_t i = 0; i < results.size(); ++i) results[i] = 0.;
          while (results.size() < order_of_inter) results.push_back(0.);

          // recurrent value calculations
          for (size_t i = 0; i < fs.size(); ++i)
          {
            const float x = fs.values[i] * fs.values[i];

            if (!PROCESS_SELF_INTERACTIONS(fs.values[i]))
            {
              for (size_t i = order_of_inter - 1; i > 0; --i) results[i] += results[i - 1] * x;

              results[0] += x;
            }
            else
            {
              results[0] += x;

              for (size_t i = 1; i < order_of_inter; ++i) results[i] += results[i - 1] * x;

              ++cnt_ft_value_non_1;
            }
          }

          sum_feat_sq_in_inter *= results[order_of_inter - 1];  // will be explained in http://bit.ly/1Hk9JX1

          // let's calculate  the number of a new features

          // if number of features is less than  order of interaction then go to the next interaction
          // as you can't make simple combination of interaction 'aaa' if a contains < 3 features.
          // unless one of them has value != 1. and we are counting them.
          const size_t ft_size = fs.size();
          if (cnt_ft_value_non_1 == 0 && ft_size < order_of_inter)
          {
            num_features_in_inter = 0;
            break;
          }

          size_t n;
          if (cnt_ft_value_non_1 == 0)  // number of generated simple combinations is C(n,k)
          {
            n = (size_t)choose((int64_t)ft_size, (int64_t)order_of_inter);
          }
          else
          {
            n = 0;
            for (size_t l = 0; l <= order_of_inter; ++l)
            {
              // C(l+m-1, l) * C(n-m, k-l)
              size_t num = (l == 0) ? 1 : (size_t)choose(l + cnt_ft_value_non_1 - 1, l);

              if (ft_size - cnt_ft_value_non_1 >= order_of_inter - l)
                num *= (size_t)choose(ft_size - cnt_ft_value_non_1, order_of_inter - l);
              else
                num = 0;

              n += num;
            }

          }  // details on http://bit.ly/1Hk9JX1

          num_features_in_inter *= n;

          ns += order_of_inter - 1;  // jump over whole block
        }
      }

      if (num_features_in_inter == 0)
        continue;  // signal that values should be ignored (as default value is 1)

      new_features_cnt += num_features_in_inter;
      new_features_value += sum_feat_sq_in_inter;
    }

#ifdef DEBUG_EVAL_COUNT_OF_GEN_FT
    if (correct_features_cnt != new_features_cnt)
      all.trace_message << "Incorrect new features count " << new_features_cnt << " must be " << correct_features_cnt
                        << endl;
    if (fabs(correct_features_value - new_features_value) > 1e-5)
      all.trace_message << "Incorrect new features value " << new_features_value << " must be "
                        << correct_features_value << endl;
#endif
  }

  results.delete_v();
}